

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
cfg::tag_bool_scalar_t<cfgfile::string_trait_t>::tag_bool_scalar_t
          (tag_bool_scalar_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  byte in_CL;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffec8;
  allocator *value;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_stack_fffffffffffffed0;
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  
  local_19 = in_CL & 1;
  cfgfile::tag_scalar_t<bool,_cfgfile::string_trait_t>::tag_scalar_t
            ((tag_scalar_t<bool,_cfgfile::string_trait_t> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,(string_t *)in_stack_fffffffffffffec0,
             (bool)in_stack_fffffffffffffebf);
  *in_RDI = &PTR__tag_bool_scalar_t_00179aa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"string_field",&local_61);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (string_t *)in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::constraint_one_of_t(in_stack_fffffffffffffec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"one",&local_99);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffed0,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  this_00 = (constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 0x1e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"two",&local_c1);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  value = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"three",value);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::set_constraint((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                    *)(in_RDI + 0xd),
                   (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(in_RDI + 0x1e));
  return;
}

Assistant:

tag_bool_scalar_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_t< bool, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}